

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar2;
  allocator<char> local_b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splt;
  StringAdapter str;
  StringAdapter local_78;
  string local_58;
  char *local_38;
  size_type local_30;
  char local_28 [8];
  undefined8 uStack_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Hello World",(allocator<char> *)&local_78);
  str.s._M_dataplus._M_p = (pointer)&str.s.field_2;
  if (local_38 == local_28) {
    str.s.field_2._8_8_ = uStack_20;
  }
  else {
    str.s._M_dataplus._M_p = local_38;
  }
  str.s._M_string_length = local_30;
  local_30 = 0;
  local_28[0] = '\0';
  local_38 = local_28;
  std::__cxx11::string::~string((string *)&local_38);
  StringAdapter::to_lower(&local_78,&str);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58," ",&local_b1);
  StringAdapter::split(&splt,&local_78,&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  for (pbVar2 = splt.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != splt.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)pbVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&splt);
  std::__cxx11::string::~string((string *)&str);
  return 0;
}

Assistant:

int main()
{
	StringAdapter str("Hello World");
	auto splt{str.to_lower().split(" ")};
	for(const auto& s : splt)
	{
		std::cout << s << std::endl;
	}

	return 0;
}